

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lambertian.h
# Opt level: O1

RGBColor __thiscall
pm::Lambertian::sampleF(Lambertian *this,ShadeRecord *sr,Vector3 *wo,Vector3 *wi,float *pdf)

{
  float fVar1;
  float fVar2;
  float *in_R9;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  RGBColor RVar9;
  Vector3 sp;
  float local_3c;
  float local_38;
  float local_34;
  
  fVar4 = wo[3].y;
  fVar1 = wo[3].z;
  fVar2 = wo[4].x;
  fVar7 = fVar2 - fVar1 * 0.0071;
  fVar6 = fVar4 * 0.0071 + fVar2 * -0.0034;
  fVar8 = fVar1 * 0.0034 - fVar4;
  fVar3 = fVar8 * fVar8 + fVar7 * fVar7 + fVar6 * fVar6;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar7 = fVar7 / fVar3;
  fVar6 = fVar6 / fVar3;
  fVar8 = fVar8 / fVar3;
  SamplerState::sampleHemisphere((SamplerState *)&local_3c);
  fVar5 = fVar4 * local_34 + fVar7 * local_38 + (fVar6 * fVar2 - fVar1 * fVar8) * local_3c;
  fVar3 = fVar1 * local_34 + fVar6 * local_38 + (fVar8 * fVar4 - fVar2 * fVar7) * local_3c;
  fVar4 = fVar2 * local_34 + fVar8 * local_38 + (fVar7 * fVar1 - fVar4 * fVar6) * local_3c;
  *pdf = fVar5;
  pdf[1] = fVar3;
  pdf[2] = fVar4;
  fVar4 = fVar4 * fVar4 + fVar5 * fVar5 + fVar3 * fVar3;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar1 = *pdf;
  fVar2 = pdf[1];
  *pdf = fVar1 / fVar4;
  pdf[1] = fVar2 / fVar4;
  fVar3 = pdf[2];
  pdf[2] = fVar3 / fVar4;
  *in_R9 = ((fVar3 / fVar4) * wo[4].x + (fVar1 / fVar4) * wo[3].y + (fVar2 / fVar4) * wo[3].z) *
           0.31830987;
  fVar4 = (sr->localHitPoint).y;
  fVar1 = (sr->normal).x;
  RVar9.b = fVar4 * (sr->normal).y * 0.31830987;
  *(float *)&(this->super_BRDF)._vptr_BRDF = (sr->localHitPoint).z * fVar4 * 0.31830987;
  *(float *)((long)&(this->super_BRDF)._vptr_BRDF + 4) = fVar1 * fVar4 * 0.31830987;
  *(float *)&(this->super_BRDF).samplerState_.count_ = RVar9.b;
  RVar9.r = 0.31830987;
  RVar9.g = 0.0;
  return RVar9;
}

Assistant:

inline RGBColor Lambertian::sampleF(const ShadeRecord &sr, const Vector3 &wo, Vector3 &wi, float &pdf) const
{
	const Vector3 w = sr.normal;
	// jitter the up vector in case normal is vertical
	Vector3 v = cross(Vector3(0.0034f, 1.0f, 0.0071f), w);
	v.normalize();
	const Vector3 u = cross(v, w);

	const Vector3 sp = samplerState_.sampleHemisphere();
	wi = sp.x * u + sp.y * v + sp.z * w;
	wi.normalize();

	pdf = dot(sr.normal, wi) * invPi;

	return (kd_ * cd_ * invPi);
}